

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O1

int CVodeGetSens1(void *cvode_mem,sunrealtype *tret,int is,N_Vector ySout)

{
  int iVar1;
  
  if (cvode_mem != (void *)0x0) {
    *tret = *(sunrealtype *)((long)cvode_mem + 0x410);
    iVar1 = CVodeGetSensDky1(cvode_mem,*(sunrealtype *)((long)cvode_mem + 0x410),0,is,ySout);
    return iVar1;
  }
  cvProcessError((CVodeMem)0x0,-0x15,0xfc8,"CVodeGetSens1",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes.c"
                 ,"cvode_mem = NULL illegal.");
  return -0x15;
}

Assistant:

int CVodeGetSens1(void* cvode_mem, sunrealtype* tret, int is, N_Vector ySout)
{
  CVodeMem cv_mem;
  int flag;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  *tret = cv_mem->cv_tretlast;

  flag = CVodeGetSensDky1(cvode_mem, cv_mem->cv_tretlast, 0, is, ySout);

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (flag);
}